

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O3

void Assimp::Write(JSONWriter *out,aiCamera *ai,bool is_elem)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  stringstream *psVar2;
  stringstream *psVar3;
  string local_48;
  
  JSONWriter::StartObj(out,is_elem);
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"name","");
  JSONWriter::Key(out,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  psVar3 = &out->buff;
  psVar2 = JSONWriter::LiteralToString(out,psVar3,&ai->mName);
  local_48._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(psVar2 + 0x10),(char *)&local_48,1)
  ;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"aspect","");
  JSONWriter::Key(out,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  psVar2 = JSONWriter::LiteralToString(out,psVar3,ai->mAspect);
  local_48._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(psVar2 + 0x10),(char *)&local_48,1)
  ;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"clipplanefar","");
  JSONWriter::Key(out,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  psVar2 = JSONWriter::LiteralToString(out,psVar3,ai->mClipPlaneFar);
  local_48._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(psVar2 + 0x10),(char *)&local_48,1)
  ;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"clipplanenear","");
  JSONWriter::Key(out,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  psVar2 = JSONWriter::LiteralToString(out,psVar3,ai->mClipPlaneNear);
  local_48._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(psVar2 + 0x10),(char *)&local_48,1)
  ;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"horizontalfov","");
  JSONWriter::Key(out,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  psVar3 = JSONWriter::LiteralToString(out,psVar3,ai->mHorizontalFOV);
  local_48._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(psVar3 + 0x10),(char *)&local_48,1)
  ;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"up","");
  JSONWriter::Key(out,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  Write(out,&ai->mUp,false);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"lookat","");
  JSONWriter::Key(out,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  Write(out,&ai->mLookAt,false);
  JSONWriter::EndObj(out);
  return;
}

Assistant:

void Write(JSONWriter& out, const aiCamera& ai, bool is_elem = true) {
    out.StartObj(is_elem);

    out.Key("name");
    out.SimpleValue(ai.mName);

    out.Key("aspect");
    out.SimpleValue(ai.mAspect);

    out.Key("clipplanefar");
    out.SimpleValue(ai.mClipPlaneFar);

    out.Key("clipplanenear");
    out.SimpleValue(ai.mClipPlaneNear);

    out.Key("horizontalfov");
    out.SimpleValue(ai.mHorizontalFOV);

    out.Key("up");
    Write(out, ai.mUp, false);

    out.Key("lookat");
    Write(out, ai.mLookAt, false);

    out.EndObj();
}